

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
::clear(table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
        *this)

{
  size_t sVar1;
  group_type_pointer pgVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  group_type_pointer pgVar6;
  uint uVar7;
  value_type_pointer ppVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  
  ppVar8 = (this->arrays).elements_;
  if (ppVar8 != (value_type_pointer)0x0) {
    sVar1 = (this->arrays).groups_size_mask;
    pgVar2 = (this->arrays).groups_;
    if (pgVar2 != pgVar2 + sVar1 + 1) {
      pgVar6 = pgVar2;
      do {
        auVar10[0] = -(pgVar6->m[0].n == '\0');
        auVar10[1] = -(pgVar6->m[1].n == '\0');
        auVar10[2] = -(pgVar6->m[2].n == '\0');
        auVar10[3] = -(pgVar6->m[3].n == '\0');
        auVar10[4] = -(pgVar6->m[4].n == '\0');
        auVar10[5] = -(pgVar6->m[5].n == '\0');
        auVar10[6] = -(pgVar6->m[6].n == '\0');
        auVar10[7] = -(pgVar6->m[7].n == '\0');
        auVar10[8] = -(pgVar6->m[8].n == '\0');
        auVar10[9] = -(pgVar6->m[9].n == '\0');
        auVar10[10] = -(pgVar6->m[10].n == '\0');
        auVar10[0xb] = -(pgVar6->m[0xb].n == '\0');
        auVar10[0xc] = -(pgVar6->m[0xc].n == '\0');
        auVar10[0xd] = -(pgVar6->m[0xd].n == '\0');
        auVar10[0xe] = -(pgVar6->m[0xe].n == '\0');
        auVar10[0xf] = -(pgVar6->m[0xf].n == '\0');
        for (uVar7 = ((uint)(pgVar2 + sVar1 != pgVar6) << 0xe | 0x3fff) &
                     ~(uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(auVar10[0xf] >> 7) << 0xf); uVar7 != 0;
            uVar7 = uVar7 - 1 & uVar7) {
          uVar3 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          this_00 = ppVar8[uVar3].second.
                    super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        pgVar6->m[0].n = (undefined1  [16])0x0;
        ppVar8 = ppVar8 + 0xf;
        bVar9 = pgVar6 != pgVar2 + sVar1;
        pgVar6 = pgVar6 + 1;
      } while (bVar9);
    }
    (this->arrays).groups_[(this->arrays).groups_size_mask].m[0xe].n = '\x01';
    uVar4 = (this->arrays).groups_size_mask * 0xf + 0xe;
    if ((this->arrays).elements_ == (value_type_pointer)0x0) {
      uVar4 = 0;
    }
    uVar5 = (ulong)((float)uVar4 * 0.875);
    uVar5 = (long)((float)uVar4 * 0.875 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    if (uVar4 < 0x1e) {
      uVar5 = uVar4;
    }
    (this->size_ctrl).ml = uVar5;
    (this->size_ctrl).size = 0;
  }
  return;
}

Assistant:

group_type* groups() const noexcept { return std::to_address(groups_); }